

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_passphrase.c
# Opt level: O0

int set_passphrase(archive_write *a,char *p)

{
  char *pcVar1;
  char *p_local;
  archive_write *a_local;
  
  if ((p == (char *)0x0) || (*p == '\0')) {
    archive_set_error(&a->archive,-1,"Empty passphrase is unacceptable");
    a_local._4_4_ = -0x19;
  }
  else {
    free(a->passphrase);
    pcVar1 = strdup(p);
    a->passphrase = pcVar1;
    if (a->passphrase == (char *)0x0) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate data for passphrase");
      a_local._4_4_ = -0x1e;
    }
    else {
      a_local._4_4_ = 0;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
set_passphrase(struct archive_write *a, const char *p)
{
	if (p == NULL || p[0] == '\0') {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Empty passphrase is unacceptable");
		return (ARCHIVE_FAILED);
	}
	free(a->passphrase);
	a->passphrase = strdup(p);
	if (a->passphrase == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate data for passphrase");
		return (ARCHIVE_FATAL);
	}
	return (ARCHIVE_OK);
}